

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS
ref_geom_tri_uv_bounding_box(REF_GRID ref_grid,REF_INT node,REF_DBL *uv_min,REF_DBL *uv_max)

{
  uint uVar1;
  REF_INT local_10c;
  undefined8 local_108;
  REF_DBL local_100;
  REF_INT local_f4;
  int local_f0;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT nodes [27];
  REF_INT sense;
  REF_DBL uv [2];
  REF_INT local_50;
  REF_INT iuv;
  REF_INT id;
  REF_INT cell_node;
  REF_INT cell;
  REF_INT item;
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  REF_DBL *uv_max_local;
  REF_DBL *uv_min_local;
  REF_GRID pRStack_18;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  ref_cell = (REF_CELL)ref_grid->geom;
  _cell = ref_grid->cell[3];
  ref_geom = (REF_GEOM)uv_max;
  uv_max_local = uv_min;
  uv_min_local._4_4_ = node;
  pRStack_18 = ref_grid;
  uVar1 = ref_geom_unique_id((REF_GEOM)ref_cell,node,2,&local_50);
  if (uVar1 == 0) {
    uVar1 = ref_geom_tuv((REF_GEOM)ref_cell,uv_min_local._4_4_,2,local_50,uv_max_local);
    if (uVar1 == 0) {
      uVar1 = ref_geom_tuv((REF_GEOM)ref_cell,uv_min_local._4_4_,2,local_50,(REF_DBL *)ref_geom);
      if (uVar1 == 0) {
        if ((uv_min_local._4_4_ < 0) || (_cell->ref_adj->nnode <= uv_min_local._4_4_)) {
          local_f0 = -1;
        }
        else {
          local_f0 = _cell->ref_adj->first[uv_min_local._4_4_];
        }
        cell_node = local_f0;
        if (local_f0 == -1) {
          local_f4 = -1;
        }
        else {
          local_f4 = _cell->ref_adj->item[local_f0].ref;
        }
        id = local_f4;
        while (cell_node != -1) {
          uVar1 = ref_cell_nodes(_cell,id,&ref_private_macro_code_rss_1);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x5cd,"ref_geom_tri_uv_bounding_box",(ulong)uVar1,"cell nodes");
            return uVar1;
          }
          for (iuv = 0; iuv < _cell->node_per; iuv = iuv + 1) {
            uVar1 = ref_geom_cell_tuv((REF_GEOM)ref_cell,(&ref_private_macro_code_rss_1)[iuv],
                                      &ref_private_macro_code_rss_1,2,(REF_DBL *)(nodes + 0x1a),
                                      nodes + 0x19);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x5d1,"ref_geom_tri_uv_bounding_box",(ulong)uVar1,"cell uv");
              return uVar1;
            }
            for (uv[1]._4_4_ = 0; uv[1]._4_4_ < 2; uv[1]._4_4_ = uv[1]._4_4_ + 1) {
              if (*(double *)(nodes + (long)uv[1]._4_4_ * 2 + 0x1a) <= uv_max_local[uv[1]._4_4_]) {
                local_100 = *(REF_DBL *)(nodes + (long)uv[1]._4_4_ * 2 + 0x1a);
              }
              else {
                local_100 = uv_max_local[uv[1]._4_4_];
              }
              uv_max_local[uv[1]._4_4_] = local_100;
            }
            for (uv[1]._4_4_ = 0; uv[1]._4_4_ < 2; uv[1]._4_4_ = uv[1]._4_4_ + 1) {
              if (*(double *)(&ref_geom->n + (long)uv[1]._4_4_ * 2) <
                  *(double *)(nodes + (long)uv[1]._4_4_ * 2 + 0x1a) ||
                  *(double *)(&ref_geom->n + (long)uv[1]._4_4_ * 2) ==
                  *(double *)(nodes + (long)uv[1]._4_4_ * 2 + 0x1a)) {
                local_108 = *(undefined8 *)(nodes + (long)uv[1]._4_4_ * 2 + 0x1a);
              }
              else {
                local_108 = *(undefined8 *)(&ref_geom->n + (long)uv[1]._4_4_ * 2);
              }
              *(undefined8 *)(&ref_geom->n + (long)uv[1]._4_4_ * 2) = local_108;
            }
          }
          cell_node = _cell->ref_adj->item[cell_node].next;
          if (cell_node == -1) {
            local_10c = -1;
          }
          else {
            local_10c = _cell->ref_adj->item[cell_node].ref;
          }
          id = local_10c;
        }
        ref_grid_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x5ca,"ref_geom_tri_uv_bounding_box",(ulong)uVar1,"uv_max");
        ref_grid_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x5c9,
             "ref_geom_tri_uv_bounding_box",(ulong)uVar1,"uv_min");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x5c8,
           "ref_geom_tri_uv_bounding_box",(ulong)uVar1,"id");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_tri_uv_bounding_box(REF_GRID ref_grid, REF_INT node,
                                                REF_DBL *uv_min,
                                                REF_DBL *uv_max) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell, cell_node, id, iuv;
  REF_DBL uv[2];
  REF_INT sense;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  /* get face id and initialize min and max */
  RSS(ref_geom_unique_id(ref_geom, node, REF_GEOM_FACE, &id), "id");
  RSS(ref_geom_tuv(ref_geom, node, REF_GEOM_FACE, id, uv_min), "uv_min");
  RSS(ref_geom_tuv(ref_geom, node, REF_GEOM_FACE, id, uv_max), "uv_max");

  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      RSS(ref_geom_cell_tuv(ref_geom, nodes[cell_node], nodes, REF_GEOM_FACE,
                            uv, &sense),
          "cell uv");
      for (iuv = 0; iuv < 2; iuv++) uv_min[iuv] = MIN(uv_min[iuv], uv[iuv]);
      for (iuv = 0; iuv < 2; iuv++) uv_max[iuv] = MAX(uv_max[iuv], uv[iuv]);
    }
  }

  return REF_SUCCESS;
}